

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_SimpleMessage_Test::
~ParseMessageTest_SimpleMessage_Test(ParseMessageTest_SimpleMessage_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseMessageTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseMessageTest, SimpleMessage) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  required int32 foo = 1;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }"
      "}");
}